

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

ssize_t ossl_send(connectdata *conn,int sockindex,void *mem,size_t len,CURLcode *curlcode)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  size_t sVar4;
  char *fmt;
  Curl_easy *pCVar5;
  char error_buffer [256];
  
  ERR_clear_error();
  sVar4 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar4 = len;
  }
  uVar1 = SSL_write((SSL *)conn->ssl[sockindex].handle,mem,(int)sVar4);
  if ((int)uVar1 < 1) {
    uVar1 = SSL_get_error((SSL *)conn->ssl[sockindex].handle,uVar1);
    if (uVar1 - 2 < 2) {
      *curlcode = CURLE_AGAIN;
    }
    else {
      if (uVar1 == 1) {
        uVar3 = ERR_get_error();
        pCVar5 = conn->data;
        ERR_error_string_n(uVar3,error_buffer,0x100);
        Curl_failf(pCVar5,"SSL_write() error: %s",error_buffer);
      }
      else {
        if (uVar1 == 5) {
          pCVar5 = conn->data;
          puVar2 = (uint *)__errno_location();
          uVar1 = *puVar2;
          fmt = "SSL_write() returned SYSCALL, errno = %d";
        }
        else {
          pCVar5 = conn->data;
          fmt = "SSL_write() return error %d";
        }
        Curl_failf(pCVar5,fmt,(ulong)uVar1);
      }
      *curlcode = CURLE_SEND_ERROR;
    }
    uVar3 = 0xffffffffffffffff;
  }
  else {
    *curlcode = CURLE_OK;
    uVar3 = (ulong)uVar1;
  }
  return uVar3;
}

Assistant:

static ssize_t ossl_send(struct connectdata *conn,
                         int sockindex,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256]; /* OpenSSL documents that this must be at least 256
                             bytes long. */
  unsigned long sslerror;
  int memlen;
  int rc;

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(conn->ssl[sockindex].handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(conn->ssl[sockindex].handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      return -1;
    case SSL_ERROR_SYSCALL:
      failf(conn->data, "SSL_write() returned SYSCALL, errno = %d",
            SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    case SSL_ERROR_SSL:
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(conn->data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      return -1;
    }
    /* a true error */
    failf(conn->data, "SSL_write() return error %d", err);
    *curlcode = CURLE_SEND_ERROR;
    return -1;
  }
  *curlcode = CURLE_OK;
  return (ssize_t)rc; /* number of bytes */
}